

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

void __thiscall
flatbuffers::BinaryAnnotator::BuildVector
          (BinaryAnnotator *this,uint64_t vector_offset,Object *table,Field *field,
          uint64_t parent_table_offset,
          map<unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_flatbuffers::BinaryAnnotator::VTable::Entry>_>_>
          *vtable_fields)

{
  pointer pcVar1;
  Field FVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  BinaryAnnotator *pBVar6;
  BinaryAnnotator *this_00;
  char cVar7;
  bool bVar8;
  undefined2 uVar9;
  uint uVar10;
  ulong uVar11;
  Field *pFVar12;
  uint64_t uVar13;
  Schema *pSVar14;
  undefined8 *puVar15;
  long *plVar16;
  uint uVar17;
  size_type *psVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  _Base_ptr p_Var20;
  int *piVar21;
  long *plVar22;
  int iVar23;
  long lVar24;
  unsigned_short vtsize;
  uint64_t uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  _Base_ptr p_Var27;
  char cVar28;
  undefined8 uVar29;
  BaseType base_type;
  _Alloc_hider _Var30;
  BinaryRegionType type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  _Rb_tree_header *p_Var32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  string enum_type;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  allocator<char> local_cc1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_cc0;
  undefined1 local_cb8 [8];
  _Alloc_hider local_cb0;
  undefined1 local_ca8 [24];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_c90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c78;
  _Alloc_hider local_c68;
  size_type local_c60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c48;
  Field *local_c40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c28;
  BinaryAnnotator *local_c20;
  undefined1 local_c18 [40];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_bf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bd8;
  _Alloc_hider local_bc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bb0;
  _Alloc_hider local_ba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b90;
  string local_b78;
  undefined1 local_b58 [40];
  Schema *local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  BinaryRegionType local_b08;
  BinarySectionType local_b04;
  Object *local_b00;
  BinaryRegionStatus local_af8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_af0;
  long local_ae8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ae0;
  BinaryRegionCommentType local_ad0;
  char *local_ac8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac0;
  undefined1 *local_aa8;
  long local_aa0;
  undefined1 local_a98;
  undefined7 uStack_a97;
  size_t local_a88;
  uint64_t local_a80;
  long *local_a78;
  uint local_a70;
  long local_a68 [2];
  long *local_a58 [2];
  long local_a48 [2];
  long *local_a38 [2];
  long local_a28 [2];
  string local_a18;
  long *local_9f8 [2];
  long local_9e8 [2];
  long *local_9d8 [2];
  long local_9c8 [2];
  undefined1 local_9b8 [8];
  _Alloc_hider local_9b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a0;
  BinaryRegionCommentType local_990;
  _Alloc_hider local_988;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_978;
  _Alloc_hider local_968;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_958;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_948;
  long *local_940 [2];
  long local_930 [2];
  undefined1 local_920 [8];
  _Alloc_hider local_918;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_908;
  BinaryRegionCommentType local_8f8;
  _Alloc_hider local_8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0;
  _Alloc_hider local_8d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_8b0;
  long *local_8a8 [2];
  long local_898 [2];
  long *local_888 [2];
  long local_878 [2];
  undefined1 local_868 [8];
  _Alloc_hider local_860;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_850;
  BinaryRegionCommentType local_840;
  _Alloc_hider local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  _Alloc_hider local_818;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_7f8;
  undefined1 local_7f0 [8];
  _Alloc_hider local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d8;
  BinaryRegionCommentType local_7c8;
  _Alloc_hider local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b0;
  _Alloc_hider local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_780;
  undefined1 local_778 [8];
  _Alloc_hider local_770;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_760;
  BinaryRegionCommentType local_750;
  _Alloc_hider local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_738;
  _Alloc_hider local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_708;
  undefined1 local_700 [8];
  _Alloc_hider local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e8;
  BinaryRegionCommentType local_6d8;
  _Alloc_hider local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0;
  _Alloc_hider local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_690;
  undefined1 local_688 [8];
  _Alloc_hider local_680;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  BinaryRegionCommentType local_660;
  _Alloc_hider local_658;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_648;
  _Alloc_hider local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_618;
  undefined1 local_610 [8];
  _Alloc_hider local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  BinaryRegionCommentType local_5e8;
  _Alloc_hider local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  _Alloc_hider local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_5a0;
  undefined1 local_598 [8];
  _Alloc_hider local_590;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  BinaryRegionCommentType local_570;
  _Alloc_hider local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  _Alloc_hider local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  undefined1 local_520 [8];
  _Alloc_hider local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  BinaryRegionCommentType local_4f8;
  _Alloc_hider local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  _Alloc_hider local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b0;
  undefined1 local_4a8 [8];
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  BinaryRegionCommentType local_480;
  _Alloc_hider local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  _Alloc_hider local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  undefined1 local_430 [8];
  _Alloc_hider local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  BinaryRegionCommentType local_408;
  _Alloc_hider local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  undefined1 local_3b8 [8];
  _Alloc_hider local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  BinaryRegionCommentType local_390;
  _Alloc_hider local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  _Alloc_hider local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  long *local_340 [2];
  long local_330 [2];
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0 [2];
  long local_2b0 [2];
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  BinaryRegionCommentType local_278;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  size_t local_230;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  size_t local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_138;
  BinaryRegionComment local_120;
  BinaryRegionComment local_a8;
  
  local_b00 = table;
  bVar8 = ContainsSection(this,vector_offset);
  if (bVar8) {
    return;
  }
  local_af0 = &local_ae0;
  local_af8 = OK;
  pFVar12 = (Field *)0x0;
  local_ae8 = 0;
  local_ae0._M_local_buf[0] = '\0';
  local_ac8 = local_ac0._M_local_buf + 8;
  local_ac0._M_allocated_capacity = 0;
  local_ac0._M_local_buf[8] = '\0';
  local_aa8 = &local_a98;
  local_aa0 = 0;
  local_a98 = 0;
  local_a88 = 0;
  local_ad0 = VectorLength;
  if (6 < *(ushort *)(field + -(long)*(int *)field)) {
    uVar11 = (ulong)*(ushort *)(field + (6 - (long)*(int *)field));
    if (uVar11 == 0) {
      pFVar12 = (Field *)0x0;
    }
    else {
      pFVar12 = field + *(uint *)(field + uVar11) + uVar11;
    }
  }
  local_c40 = field;
  if (((*(ushort *)(pFVar12 + -(long)*(int *)pFVar12) < 5) ||
      ((ulong)*(ushort *)(pFVar12 + (4 - (long)*(int *)pFVar12)) == 0)) ||
     (pFVar12[*(ushort *)(pFVar12 + (4 - (long)*(int *)pFVar12))].super_Table != (Table)0x12)) {
    uVar11 = this->binary_length_;
    if (vector_offset + 3 < uVar11 && 4 < uVar11) {
      local_c30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)*(uint *)(this->binary_ + vector_offset);
      uVar25 = 4;
      type = Uint32;
      local_b04 = Vector;
      goto LAB_0030b3af;
    }
LAB_0030b5fa:
    uVar25 = 0;
    if (vector_offset <= uVar11) {
      uVar25 = uVar11 - vector_offset;
    }
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"4","");
    local_af8 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_af0);
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0],local_2b0[0] + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b58,
               (char *)(local_b00 + *(ushort *)(local_b00 + (4 - (long)*(int *)local_b00)) +
                       (ulong)*(uint *)(local_b00 +
                                       *(ushort *)(local_b00 + (4 - (long)*(int *)local_b00))) + 4),
               &local_cc1);
    plVar16 = (long *)std::__cxx11::string::append(local_b58);
    local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
    psVar18 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_b28.field_2._M_allocated_capacity = *psVar18;
      local_b28.field_2._8_8_ = plVar16[3];
    }
    else {
      local_b28.field_2._M_allocated_capacity = *psVar18;
      local_b28._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_b28._M_string_length = plVar16[1];
    *plVar16 = (long)psVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_b28);
    local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
    psVar18 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_b78.field_2._M_allocated_capacity = *psVar18;
      local_b78.field_2._8_8_ = plVar16[3];
    }
    else {
      local_b78.field_2._M_allocated_capacity = *psVar18;
      local_b78._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_b78._M_string_length = plVar16[1];
    *plVar16 = (long)psVar18;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    local_1b0._0_4_ = local_af8;
    local_1a8._M_p = (pointer)&local_198;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,local_af0,local_af0->_M_local_buf + local_ae8);
    local_188 = local_ad0;
    local_180._M_p = (pointer)&local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_ac8,local_ac8 + local_ac0._M_allocated_capacity);
    local_160._M_p = (pointer)&local_150;
    std::__cxx11::string::_M_construct<char*>((string *)&local_160,local_aa8,local_aa8 + local_aa0);
    local_140 = local_a88;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_c18,vector_offset,uVar25,Unknown,uVar25,0,
               (BinaryRegionComment *)local_1b0);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_cb8,&local_b78,Vector,(BinaryRegion *)local_c18);
    AddSection(this,vector_offset,(BinarySection *)local_cb8);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_c90);
    if (local_cb8 != (undefined1  [8])local_ca8) {
      operator_delete((void *)local_cb8,local_ca8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_p != &local_b90) {
      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_p != &local_bb0) {
      operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf0.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
      operator_delete(local_bf0.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bd8._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_p != &local_150) {
      operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
    }
    _Var30._M_p = local_1a8._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
LAB_0030c543:
      operator_delete(_Var30._M_p,local_198._M_allocated_capacity + 1);
    }
  }
  else {
    uVar11 = this->binary_length_;
    if (uVar11 <= vector_offset + 7 || uVar11 < 9) goto LAB_0030b5fa;
    local_c30 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)(this->binary_ + vector_offset);
    uVar25 = 8;
    type = Uint64;
    local_b04 = Vector64;
LAB_0030b3af:
    local_cc0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)parent_table_offset;
    uVar13 = GetElementSize(this,field);
    local_c38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(vector_offset + uVar25);
    if (local_c38->_M_local_buf + uVar13 * (long)local_c30 + -1 < (char *)this->binary_length_) {
      local_b58._0_8_ = (pointer)0x0;
      local_b58._8_8_ = (pointer)0x0;
      local_b58._16_8_ = (pointer)0x0;
      local_228._0_4_ = local_af8;
      local_220._M_p = (pointer)&local_210;
      local_a80 = vector_offset;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,local_af0,local_af0->_M_local_buf + local_ae8);
      local_200 = local_ad0;
      local_1f8._M_p = (pointer)&local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_ac8,local_ac8 + local_ac0._M_allocated_capacity);
      local_c20 = this;
      local_1d8._M_p = (pointer)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_aa8,local_aa8 + local_aa0);
      local_1b8 = local_a88;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_c18,local_a80,uVar25,type,0,0,
                 (BinaryRegionComment *)local_228);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>
                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                 local_b58,(BinaryRegion *)local_c18);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_ba0._M_p != &local_b90) {
        operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
      }
      pBVar6 = local_c20;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bc0._M_p != &local_bb0) {
        operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_bf0.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
        operator_delete(local_bf0.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_bd8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_p != &local_1c8) {
        operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
      }
      pFVar12 = local_c40;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_p != &local_1e8) {
        operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != &local_210) {
        operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
      }
      this_00 = local_c20;
      lVar24 = -(long)*(int *)pFVar12;
      uVar3 = *(ushort *)(pFVar12 + -(long)*(int *)pFVar12);
      if ((uVar3 < 7) || (uVar11 = (ulong)*(ushort *)(pFVar12 + lVar24 + 6), uVar11 == 0)) {
        pFVar12 = (Field *)0x0;
      }
      else {
        pFVar12 = pFVar12 + *(uint *)(pFVar12 + uVar11) + uVar11;
      }
      if ((*(ushort *)(pFVar12 + -(long)*(int *)pFVar12) < 7) ||
         ((ulong)*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12)) == 0)) {
LAB_0030c22f:
        if ((uVar3 < 7) || (uVar11 = (ulong)*(ushort *)(local_c40 + lVar24 + 6), uVar11 == 0)) {
          pFVar12 = (Field *)0x0;
        }
        else {
          pFVar12 = local_c40 + *(uint *)(local_c40 + uVar11) + uVar11;
        }
        if (((6 < *(ushort *)(pFVar12 + -(long)*(int *)pFVar12)) &&
            ((ulong)*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12)) != 0)) &&
           ((int)(char)pFVar12[*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12))].super_Table - 1U
            < 0xc)) {
          if ((uVar3 < 7) || (uVar11 = (ulong)*(ushort *)(local_c40 + lVar24 + 6), uVar11 == 0)) {
            pFVar12 = (Field *)0x0;
          }
          else {
            pFVar12 = local_c40 + *(uint *)(local_c40 + uVar11) + uVar11;
          }
          base_type = None;
          if ((6 < *(ushort *)(pFVar12 + -(long)*(int *)pFVar12)) &&
             (base_type = None, (ulong)*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12)) != 0)) {
            base_type = (BaseType)
                        (char)pFVar12[*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12))].
                              super_Table;
          }
          local_b08 = GetRegionType(base_type);
          if ((uVar3 < 7) || (uVar11 = (ulong)*(ushort *)(local_c40 + lVar24 + 6), uVar11 == 0)) {
            pFVar12 = (Field *)0x0;
          }
          else {
            pFVar12 = local_c40 + *(uint *)(local_c40 + uVar11) + uVar11;
          }
          if ((*(ushort *)(pFVar12 + -(long)*(int *)pFVar12) < 7) ||
             ((ulong)*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12)) == 0)) {
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)(uint)(int)(char)pFVar12[*(ushort *)
                                                      (pFVar12 + (6 - (long)*(int *)pFVar12))].
                                             super_Table;
          }
          if (local_c30 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_cc0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(&GetTypeSize(reflection::BaseType)::sizes)[uVar11];
            pcVar1 = local_ca8 + 8;
            local_b30 = (Schema *)(local_cc0->_M_local_buf + -1);
            local_c28 = &local_b90;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            do {
              paVar33 = local_c38;
              local_c68._M_p = (pointer)&local_c58;
              local_c90.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c78;
              local_cb8 = (undefined1  [8])((ulong)local_cb8 & 0xffffffff00000000);
              local_ca8._0_8_ = 0;
              local_ca8._8_8_ = local_ca8._8_8_ & 0xffffffffffffff00;
              local_c90.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_c78._M_local_buf[0] = '\0';
              local_c60 = 0;
              local_c58._M_local_buf[0] = '\0';
              local_c90.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorValue;
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c20->binary_length_;
              local_cb0._M_p = pcVar1;
              local_c48 = paVar26;
              if ((local_cc0 < paVar19) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_b30 + (long)local_c38) < paVar19)) {
                lVar24 = -(long)*(int *)local_c40;
                if ((*(ushort *)(local_c40 + -(long)*(int *)local_c40) < 7) ||
                   (uVar11 = (ulong)*(ushort *)(local_c40 + lVar24 + 6), uVar11 == 0)) {
                  pFVar12 = (Field *)0x0;
                }
                else {
                  pFVar12 = local_c40 + *(uint *)(local_c40 + uVar11) + uVar11;
                }
                if (((6 < *(ushort *)(pFVar12 + -(long)*(int *)pFVar12)) &&
                    ((ulong)*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12)) != 0)) &&
                   ((pFVar12[*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12))].super_Table ==
                     (Table)0x10 ||
                    (pFVar12[*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12))].super_Table ==
                     (Table)0x1)))) {
                  uVar10 = 0;
                  if (local_c38 < paVar19 &&
                      paVar19 >=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x2) {
                    uVar10 = (uint)local_c20->binary_[(long)local_c38];
                  }
                  if ((*(ushort *)(local_c40 + -(long)*(int *)local_c40) < 7) ||
                     (uVar11 = (ulong)*(ushort *)(local_c40 + lVar24 + 6), uVar11 == 0)) {
                    pFVar12 = (Field *)0x0;
                  }
                  else {
                    pFVar12 = local_c40 + *(uint *)(local_c40 + uVar11) + uVar11;
                  }
                  uVar17 = 0xffffffff;
                  if ((8 < *(ushort *)(pFVar12 + -(long)*(int *)pFVar12)) &&
                     ((ulong)*(ushort *)(pFVar12 + (8 - (long)*(int *)pFVar12)) != 0)) {
                    uVar17 = *(uint *)(pFVar12 + *(ushort *)(pFVar12 + (8 - (long)*(int *)pFVar12)))
                    ;
                  }
                  if (paVar19 <= local_c38 ||
                      paVar19 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x2) {
                    std::__throw_bad_optional_access();
                  }
                  pSVar14 = local_c20->schema_;
                  uVar11 = (ulong)*(ushort *)(pSVar14 + (6 - (long)*(int *)pSVar14));
                  if ((*(uint *)(pSVar14 + *(uint *)(pSVar14 + uVar11) + uVar11) <= uVar17) ||
                     (lVar24 = *(uint *)(pSVar14 + uVar11) + uVar11,
                     lVar4 = (ulong)(uVar17 << 2) + lVar24,
                     lVar5 = (ulong)*(uint *)(pSVar14 + (ulong)(uVar17 << 2) + lVar24 + 4) + lVar4 +
                             4,
                     *(uint *)(pSVar14 +
                              (ulong)*(uint *)(pSVar14 +
                                              (ulong)*(ushort *)
                                                      (pSVar14 +
                                                      (lVar5 - *(int *)(pSVar14 +
                                                                       (ulong)*(uint *)(pSVar14 +
                                                                                       (ulong)(
                                                  uVar17 << 2) + lVar24 + 4) + 4 + lVar4)) + 6) +
                                              lVar5) +
                              (ulong)*(ushort *)
                                      (pSVar14 +
                                      (lVar5 - *(int *)(pSVar14 +
                                                       (ulong)*(uint *)(pSVar14 +
                                                                       (ulong)(uVar17 << 2) +
                                                                       lVar24 + 4) + 4 + lVar4)) + 6
                                      ) + lVar5) <= uVar10)) {
                    local_a58[0] = local_a48;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_a58,"");
                    local_cb8._0_4_ = 0xce;
                    std::__cxx11::string::_M_assign((string *)&local_cb0);
                    if (local_a58[0] != local_a48) {
                      operator_delete(local_a58[0],local_a48[0] + 1);
                    }
                    local_7f0._0_4_ = local_cb8._0_4_;
                    local_7e8._M_p = (pointer)&local_7d8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_7e8,local_cb0._M_p,local_cb0._M_p + local_ca8._0_8_)
                    ;
                    local_7c8 = (BinaryRegionCommentType)
                                local_c90.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_7c0._M_p = (pointer)&local_7b0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_7c0,
                               local_c90.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (char *)((long)local_c90.
                                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                       (long)&(local_c90.
                                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              offset));
                    local_7a0._M_p = (pointer)&local_790;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_7a0,local_c68._M_p,local_c68._M_p + local_c60);
                    local_780 = local_c48;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_c18,(uint64_t)paVar33,(uint64_t)local_cc0,
                               local_b08,0,0,(BinaryRegionComment *)local_7f0);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>
                              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                *)local_b58,(BinaryRegion *)local_c18);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba0._M_p != local_c28) {
                      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bc0._M_p != &local_bb0) {
                      operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bf0.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                      operator_delete(local_bf0.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bd8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7a0._M_p != &local_790) {
                      operator_delete(local_7a0._M_p,local_790._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7c0._M_p != &local_7b0) {
                      operator_delete(local_7c0._M_p,local_7b0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_7e8._M_p != &local_7d8) {
                      operator_delete(local_7e8._M_p,local_7d8._M_allocated_capacity + 1);
                    }
                    local_c38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(local_cc0->_M_local_buf + (long)paVar33);
                    iVar23 = 0x11;
                    goto LAB_0030cf1c;
                  }
                }
                local_868._0_4_ = OK;
                local_860._M_p = (pointer)&local_850;
                std::__cxx11::string::_M_construct<char*>((string *)&local_860,pcVar1,pcVar1);
                local_840 = (BinaryRegionCommentType)
                            local_c90.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_838._M_p = (pointer)&local_828;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_838,
                           local_c90.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c90.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c90.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                local_818._M_p = (pointer)&local_808;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_818,local_c68._M_p,local_c68._M_p + local_c60);
                local_7f8 = local_c48;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c18,(uint64_t)paVar33,(uint64_t)local_cc0,local_b08
                           ,0,0,(BinaryRegionComment *)local_868);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_c18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != local_c28) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bc0._M_p != &local_bb0) {
                  operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bf0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                  operator_delete(local_bf0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bd8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_818._M_p != &local_808) {
                  operator_delete(local_818._M_p,local_808._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_838._M_p != &local_828) {
                  operator_delete(local_838._M_p,local_828._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_860._M_p != &local_850) {
                  operator_delete(local_860._M_p,local_850._M_allocated_capacity + 1);
                }
                local_c38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_cc0->_M_local_buf + (long)paVar33);
                iVar23 = 0;
              }
              else {
                uVar25 = 0;
                if (local_c38 <= paVar19) {
                  uVar25 = (long)paVar19 - (long)local_c38;
                }
                cVar28 = '\x01';
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x9 < local_cc0) {
                  paVar19 = local_cc0;
                  cVar7 = '\x04';
                  do {
                    cVar28 = cVar7;
                    if (paVar19 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x64) {
                      cVar28 = cVar28 + -2;
                      goto LAB_0030ccde;
                    }
                    if (paVar19 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x3e8) {
                      cVar28 = cVar28 + -1;
                      goto LAB_0030ccde;
                    }
                    if (paVar19 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x2710) goto LAB_0030ccde;
                    bVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x1869f < paVar19;
                    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((ulong)paVar19 / 10000);
                    cVar7 = cVar28 + '\x04';
                  } while (bVar8);
                  cVar28 = cVar28 + '\x01';
                }
LAB_0030ccde:
                local_a78 = local_a68;
                std::__cxx11::string::_M_construct((ulong)&local_a78,cVar28);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_a78,local_a70,(unsigned_long)local_cc0);
                local_cb8._0_4_ = 0xca;
                std::__cxx11::string::_M_assign((string *)&local_cb0);
                if (local_a78 != local_a68) {
                  operator_delete(local_a78,local_a68[0] + 1);
                }
                local_778._0_4_ = local_cb8._0_4_;
                local_770._M_p = (pointer)&local_760;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_770,local_cb0._M_p,local_cb0._M_p + local_ca8._0_8_);
                local_750 = (BinaryRegionCommentType)
                            local_c90.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_748._M_p = (pointer)&local_738;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_748,
                           local_c90.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c90.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c90.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                local_728._M_p = (pointer)&local_718;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_728,local_c68._M_p,local_c68._M_p + local_c60);
                local_708 = local_c48;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c18,(uint64_t)paVar33,uVar25,Unknown,uVar25,0,
                           (BinaryRegionComment *)local_778);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_c18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != local_c28) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bc0._M_p != &local_bb0) {
                  operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bf0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                  operator_delete(local_bf0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bd8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_728._M_p != &local_718) {
                  operator_delete(local_728._M_p,local_718._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_748._M_p != &local_738) {
                  operator_delete(local_748._M_p,local_738._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_770._M_p != &local_760) {
                  operator_delete(local_770._M_p,local_760._M_allocated_capacity + 1);
                }
                iVar23 = 0xf;
              }
LAB_0030cf1c:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c68._M_p != &local_c58) {
                operator_delete(local_c68._M_p,
                                CONCAT71(local_c58._M_allocated_capacity._1_7_,
                                         local_c58._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c90.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_c78) {
                operator_delete(local_c90.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                CONCAT71(local_c78._M_allocated_capacity._1_7_,
                                         local_c78._M_local_buf[0]) + 1);
              }
              if (local_cb0._M_p != pcVar1) {
                operator_delete(local_cb0._M_p,local_ca8._8_8_ + 1);
              }
            } while (((iVar23 == 0x11) || (iVar23 == 0)) &&
                    (paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(paVar26->_M_local_buf + 1), paVar26 != local_c30));
          }
        }
      }
      else {
        FVar2.super_Table = pFVar12[*(ushort *)(pFVar12 + (6 - (long)*(int *)pFVar12))].super_Table;
        if (FVar2.super_Table == (Table)0x10) {
          uVar9 = 0xffff;
          if ((8 < uVar3) && ((ulong)*(ushort *)(local_c40 + lVar24 + 8) != 0)) {
            uVar9 = *(short *)(local_c40 + *(ushort *)(local_c40 + lVar24 + 8)) - _S_black;
          }
          p_Var20 = (vtable_fields->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var20 != (_Base_ptr)0x0) {
            p_Var32 = &(vtable_fields->_M_t)._M_impl.super__Rb_tree_header;
            p_Var27 = &p_Var32->_M_header;
            do {
              bVar8 = (ushort)(short)p_Var20[1]._M_color < (ushort)uVar9;
              if (!bVar8) {
                p_Var27 = p_Var20;
              }
              p_Var20 = (&p_Var20->_M_left)[bVar8];
            } while (p_Var20 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var27 != p_Var32) &&
               ((ushort)(short)p_Var27[1]._M_color <= (ushort)uVar9)) {
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c20->binary_length_;
              if ((paVar26 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x3) ||
                 (uVar11 = (ulong)*(ushort *)&p_Var27[1]._M_left,
                 paVar26 <=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_cc0->_M_local_buf + uVar11 + 1))) {
                uVar25 = (long)paVar26 - (long)local_c38;
                if (paVar26 < local_c38) {
                  uVar25 = 0;
                }
                local_cb0._M_p = local_ca8 + 8;
                local_cb8 = (undefined1  [8])((ulong)local_cb8 & 0xffffffff00000000);
                local_ca8._0_8_ = 0;
                local_ca8._8_8_ = local_ca8._8_8_ & 0xffffffffffffff00;
                local_c90.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c78;
                local_c90.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_c78._M_local_buf[0] = '\0';
                local_c68._M_p = (pointer)&local_c58;
                local_c60 = 0;
                local_c58._M_local_buf[0] = '\0';
                local_c48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0;
                local_c90.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorUnionValue;
                local_300[0] = local_2f0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"2","");
                local_cb8._0_4_ = 0xca;
                std::__cxx11::string::_M_assign((string *)&local_cb0);
                if (local_300[0] != local_2f0) {
                  operator_delete(local_300[0],local_2f0[0] + 1);
                }
                BinaryRegionComment::BinaryRegionComment(&local_a8,(BinaryRegionComment *)local_cb8)
                ;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c18,(uint64_t)local_c38,uVar25,Unknown,uVar25,0,
                           &local_a8);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_c18);
                BinaryRegion::~BinaryRegion((BinaryRegion *)local_c18);
                BinaryRegionComment::~BinaryRegionComment(&local_a8);
                BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_cb8);
              }
              else if (local_c30 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0) {
                local_b30 = (Schema *)
                            (local_cc0->_M_local_buf +
                            uVar11 + *(ushort *)(local_c20->binary_ + (long)local_cc0 + uVar11) + 4)
                ;
                paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
                local_cc0 = &local_b90;
                do {
                  paVar33 = local_c38;
                  local_cb0._M_p = local_ca8 + 8;
                  local_cb8 = (undefined1  [8])((ulong)local_cb8 & 0xffffffff00000000);
                  local_ca8._0_8_ = 0;
                  local_ca8._8_8_ = local_ca8._8_8_ & 0xffffffffffffff00;
                  local_c90.
                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c78;
                  local_c90.
                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_c78._M_local_buf[0] = '\0';
                  local_c68._M_p = (pointer)&local_c58;
                  local_c60 = 0;
                  local_c58._M_local_buf[0] = '\0';
                  local_c90.
                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorUnionValue;
                  paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_c20->binary_length_;
                  local_c48 = paVar26;
                  if (paVar19 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x5 ||
                      paVar19 <=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_c38->_M_local_buf + 3)) {
                    uVar25 = 0;
                    if (local_c38 <= paVar19) {
                      uVar25 = (long)paVar19 - (long)local_c38;
                    }
                    local_320[0] = local_310;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"4","");
                    local_cb8._0_4_ = 0xca;
                    std::__cxx11::string::_M_assign((string *)&local_cb0);
                    if (local_320[0] != local_310) {
                      operator_delete(local_320[0],local_310[0] + 1);
                    }
                    local_610._0_4_ = local_cb8._0_4_;
                    local_608._M_p = (pointer)&local_5f8;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_608,local_cb0._M_p,local_cb0._M_p + local_ca8._0_8_)
                    ;
                    local_5e8 = (BinaryRegionCommentType)
                                local_c90.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_5e0._M_p = (pointer)&local_5d0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_5e0,
                               local_c90.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (char *)((long)local_c90.
                                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                       (long)&(local_c90.
                                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              offset));
                    local_5c0._M_p = (pointer)&local_5b0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_5c0,local_c68._M_p,local_c68._M_p + local_c60);
                    local_5a0 = local_c48;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_c18,(uint64_t)paVar33,uVar25,Unknown,uVar25,0,
                               (BinaryRegionComment *)local_610);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>
                              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                *)local_b58,(BinaryRegion *)local_c18);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba0._M_p != local_cc0) {
                      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bc0._M_p != &local_bb0) {
                      operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bf0.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                      operator_delete(local_bf0.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bd8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5c0._M_p != &local_5b0) {
                      operator_delete(local_5c0._M_p,local_5b0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e0._M_p != &local_5d0) {
                      operator_delete(local_5e0._M_p,local_5d0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_608._M_p != &local_5f8) {
                      operator_delete(local_608._M_p,local_5f8._M_allocated_capacity + 1);
                    }
                    iVar23 = 0xc;
                  }
                  else {
                    paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((ulong)*(uint *)(local_c20->binary_ + (long)local_c38) +
                                 (long)local_c38);
                    if (paVar31 < paVar19) {
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_b30 + (long)paVar26) < paVar19) {
                        p_Var20 = p_Var27[1]._M_parent;
                        if ((*(ushort *)((long)p_Var20 - (long)(int)p_Var20->_M_color) < 7) ||
                           (uVar11 = (ulong)*(ushort *)
                                             ((long)p_Var20 + (6 - (long)(int)p_Var20->_M_color)),
                           uVar11 == 0)) {
                          piVar21 = (int *)0x0;
                        }
                        else {
                          piVar21 = (int *)((long)&p_Var20->_M_color +
                                           *(uint *)((long)&p_Var20->_M_color + uVar11) + uVar11);
                        }
                        uVar10 = 0xffffffff;
                        if ((8 < *(ushort *)((long)piVar21 - (long)*piVar21)) &&
                           (uVar11 = (ulong)*(ushort *)((long)piVar21 + (8 - (long)*piVar21)),
                           uVar11 != 0)) {
                          uVar10 = *(uint *)((long)piVar21 + uVar11);
                        }
                        pSVar14 = local_c20->schema_;
                        uVar11 = (ulong)*(ushort *)(pSVar14 + (6 - (long)*(int *)pSVar14));
                        if (uVar10 < *(uint *)(pSVar14 + *(uint *)(pSVar14 + uVar11) + uVar11)) {
                          lVar24 = *(uint *)(pSVar14 + uVar11) + uVar11;
                          lVar4 = (ulong)(uVar10 << 2) + lVar24;
                          lVar5 = (ulong)*(uint *)(pSVar14 + (ulong)(uVar10 << 2) + lVar24 + 4) +
                                  lVar4 + 4;
                          if ((uint)(byte)paVar26->_M_local_buf
                                          [(long)(local_c20->binary_ + (long)local_b30)] <
                              *(uint *)(pSVar14 +
                                       (ulong)*(uint *)(pSVar14 +
                                                       (ulong)*(ushort *)
                                                               (pSVar14 +
                                                               (lVar5 - *(int *)(pSVar14 +
                                                                                (ulong)*(uint *)(
                                                  pSVar14 + (ulong)(uVar10 << 2) + lVar24 + 4) + 4 +
                                                  lVar4)) + 6) + lVar5) +
                                       (ulong)*(ushort *)
                                               (pSVar14 +
                                               (lVar5 - *(int *)(pSVar14 +
                                                                (ulong)*(uint *)(pSVar14 +
                                                                                (ulong)(uVar10 << 2)
                                                                                + lVar24 + 4) + 4 +
                                                                lVar4)) + 6) + lVar5)) {
                            BuildUnion_abi_cxx11_
                                      (&local_b78,local_c20,(uint64_t)paVar31,
                                       paVar26->_M_local_buf
                                       [(long)(local_c20->binary_ + (long)local_b30)],local_c40);
                            std::operator+(&local_b28,"(`",&local_b78);
                            plVar16 = (long *)std::__cxx11::string::append((char *)&local_b28);
                            local_c18._0_8_ = local_c18 + 0x10;
                            plVar22 = plVar16 + 2;
                            if ((long *)*plVar16 == plVar22) {
                              local_c18._16_8_ = *plVar22;
                              local_c18._24_8_ = plVar16[3];
                            }
                            else {
                              local_c18._16_8_ = *plVar22;
                              local_c18._0_8_ = (long *)*plVar16;
                            }
                            local_c18._8_8_ = plVar16[1];
                            *plVar16 = (long)plVar22;
                            plVar16[1] = 0;
                            *(undefined1 *)(plVar16 + 2) = 0;
                            std::__cxx11::string::operator=
                                      ((string *)&local_c68,(string *)local_c18);
                            if ((undefined1 *)local_c18._0_8_ != local_c18 + 0x10) {
                              operator_delete((void *)local_c18._0_8_,local_c18._16_8_ + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
                              operator_delete(local_b28._M_dataplus._M_p,
                                              local_b28.field_2._M_allocated_capacity + 1);
                            }
                            BinaryRegionComment::BinaryRegionComment
                                      (&local_120,(BinaryRegionComment *)local_cb8);
                            anon_unknown_49::MakeBinaryRegion
                                      ((BinaryRegion *)local_c18,(uint64_t)paVar33,4,UOffset,0,
                                       (uint64_t)paVar31,&local_120);
                            std::
                            vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ::emplace_back<flatbuffers::BinaryRegion>
                                      ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                        *)local_b58,(BinaryRegion *)local_c18);
                            BinaryRegion::~BinaryRegion((BinaryRegion *)local_c18);
                            BinaryRegionComment::~BinaryRegionComment(&local_120);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
                              operator_delete(local_b78._M_dataplus._M_p,
                                              local_b78.field_2._M_allocated_capacity + 1);
                            }
                            paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)(paVar33->_M_local_buf + 4);
                            iVar23 = 0;
                            goto LAB_0030d934;
                          }
                        }
                        paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)(local_c38->_M_local_buf + 4);
                      }
                      else {
                        local_9f8[0] = local_9e8;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"1","");
                        local_cb8._0_4_ = 0xca;
                        std::__cxx11::string::_M_assign((string *)&local_cb0);
                        if (local_9f8[0] != local_9e8) {
                          operator_delete(local_9f8[0],local_9e8[0] + 1);
                        }
                        local_700._0_4_ = local_cb8._0_4_;
                        local_6f8._M_p = (pointer)&local_6e8;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_6f8,local_cb0._M_p,
                                   local_cb0._M_p + local_ca8._0_8_);
                        local_6d8 = (BinaryRegionCommentType)
                                    local_c90.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                        local_6d0._M_p = (pointer)&local_6c0;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_6d0,
                                   local_c90.
                                   super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (char *)((long)local_c90.
                                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                           (long)&(local_c90.
                                                                                                      
                                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->offset));
                        local_6b0._M_p = (pointer)&local_6a0;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_6b0,local_c68._M_p,local_c68._M_p + local_c60);
                        local_690 = local_c48;
                        anon_unknown_49::MakeBinaryRegion
                                  ((BinaryRegion *)local_c18,(uint64_t)paVar33,0,Unknown,0,0,
                                   (BinaryRegionComment *)local_700);
                        std::
                        vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ::emplace_back<flatbuffers::BinaryRegion>
                                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    *)local_b58,(BinaryRegion *)local_c18);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_ba0._M_p != local_cc0) {
                          operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_bc0._M_p != &local_bb0) {
                          operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_bf0.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                          operator_delete(local_bf0.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,
                                          local_bd8._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6b0._M_p != &local_6a0) {
                          operator_delete(local_6b0._M_p,local_6a0._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6d0._M_p != &local_6c0) {
                          operator_delete(local_6d0._M_p,local_6c0._M_allocated_capacity + 1);
                        }
                        uVar29 = local_6e8._M_allocated_capacity;
                        _Var30._M_p = local_6f8._M_p;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_6f8._M_p != &local_6e8) goto LAB_0030d81f;
                      }
                    }
                    else {
                      local_c28 = paVar26;
                      local_340[0] = local_330;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"");
                      local_cb8._0_4_ = 0xc9;
                      std::__cxx11::string::_M_assign((string *)&local_cb0);
                      if (local_340[0] != local_330) {
                        operator_delete(local_340[0],local_330[0] + 1);
                      }
                      local_688._0_4_ = local_cb8._0_4_;
                      local_680._M_p = (pointer)&local_670;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_680,local_cb0._M_p,
                                 local_cb0._M_p + local_ca8._0_8_);
                      local_660 = (BinaryRegionCommentType)
                                  local_c90.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      local_658._M_p = (pointer)&local_648;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_658,
                                 local_c90.
                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (char *)((long)local_c90.
                                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                ._M_impl.super__Vector_impl_data._M_finish +
                                         (long)&(local_c90.
                                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                                ->offset));
                      local_638._M_p = (pointer)&local_628;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_638,local_c68._M_p,local_c68._M_p + local_c60);
                      paVar26 = local_c28;
                      local_618 = local_c48;
                      anon_unknown_49::MakeBinaryRegion
                                ((BinaryRegion *)local_c18,(uint64_t)paVar33,4,UOffset,0,
                                 (uint64_t)paVar31,(BinaryRegionComment *)local_688);
                      std::
                      vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ::emplace_back<flatbuffers::BinaryRegion>
                                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  *)local_b58,(BinaryRegion *)local_c18);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_ba0._M_p != local_cc0) {
                        operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_bc0._M_p != &local_bb0) {
                        operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_bf0.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                        operator_delete(local_bf0.
                                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        local_bd8._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_638._M_p != &local_628) {
                        operator_delete(local_638._M_p,local_628._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_658._M_p != &local_648) {
                        operator_delete(local_658._M_p,local_648._M_allocated_capacity + 1);
                      }
                      uVar29 = local_670._M_allocated_capacity;
                      _Var30._M_p = local_680._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_680._M_p != &local_670) {
LAB_0030d81f:
                        operator_delete(_Var30._M_p,uVar29 + 1);
                      }
                    }
                    iVar23 = 0xe;
                  }
LAB_0030d934:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c68._M_p != &local_c58) {
                    operator_delete(local_c68._M_p,
                                    CONCAT71(local_c58._M_allocated_capacity._1_7_,
                                             local_c58._M_local_buf[0]) + 1);
                  }
                  local_c38 = paVar33;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c90.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_c78) {
                    operator_delete(local_c90.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    CONCAT71(local_c78._M_allocated_capacity._1_7_,
                                             local_c78._M_local_buf[0]) + 1);
                  }
                  if (local_cb0._M_p != local_ca8 + 8) {
                    operator_delete(local_cb0._M_p,local_ca8._8_8_ + 1);
                  }
                } while (((iVar23 == 0xe) || (iVar23 == 0)) &&
                        (paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(paVar26->_M_local_buf + 1), local_c30 != paVar26));
              }
            }
          }
        }
        else if (FVar2.super_Table == (Table)0xf) {
          pSVar14 = pBVar6->schema_;
          if ((*(ushort *)(pSVar14 + -(long)*(int *)pSVar14) < 5) ||
             (uVar11 = (ulong)*(ushort *)(pSVar14 + (4 - (long)*(int *)pSVar14)), uVar11 == 0)) {
            pSVar14 = (Schema *)0x0;
          }
          else {
            pSVar14 = pSVar14 + *(uint *)(pSVar14 + uVar11) + uVar11;
          }
          if ((uVar3 < 7) || (uVar11 = (ulong)*(ushort *)(local_c40 + lVar24 + 6), uVar11 == 0)) {
            pFVar12 = (Field *)0x0;
          }
          else {
            pFVar12 = local_c40 + *(uint *)(local_c40 + uVar11) + uVar11;
          }
          if (((*(ushort *)(pFVar12 + -(long)*(int *)pFVar12) < 9) ||
              ((ulong)*(ushort *)(pFVar12 + (8 - (long)*(int *)pFVar12)) == 0)) ||
             (*(uint *)pSVar14 <=
              *(uint *)(pFVar12 + *(ushort *)(pFVar12 + (8 - (long)*(int *)pFVar12))))) {
            __assert_fail("i < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                          ,0xc1,
                          "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                         );
          }
          uVar11 = (ulong)(*(uint *)(pFVar12 + *(ushort *)(pFVar12 + (8 - (long)*(int *)pFVar12)))
                          << 2);
          lVar24 = *(uint *)(pSVar14 + uVar11 + 4) + uVar11;
          local_b30 = pSVar14 + lVar24 + 4;
          if (((*(ushort *)(local_b30 + -(long)*(int *)local_b30) < 9) ||
              ((ulong)*(ushort *)(pSVar14 + ((lVar24 + 0xc) - (long)*(int *)local_b30)) == 0)) ||
             (local_b30[*(ushort *)(pSVar14 + ((lVar24 + 0xc) - (long)*(int *)local_b30))].
              super_Table == (Table)0x0)) {
            if (local_c30 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              local_c28 = &local_b90;
              paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
              do {
                pBVar6 = local_c20;
                paVar33 = local_c38;
                local_c90.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c78;
                local_cb8 = (undefined1  [8])((ulong)local_cb8 & 0xffffffff00000000);
                local_cb0._M_p = local_ca8 + 8;
                local_ca8._0_8_ = 0;
                local_ca8._8_8_ = local_ca8._8_8_ & 0xffffffffffffff00;
                local_c90.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_c78._M_local_buf[0] = '\0';
                local_c68._M_p = (pointer)&local_c58;
                local_c60 = 0;
                local_c58._M_local_buf[0] = '\0';
                local_c90.
                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorTableValue;
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_c20->binary_length_;
                local_c48 = paVar26;
                if (paVar19 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x5 ||
                    paVar19 <=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_c38->_M_local_buf + 3)) {
                  uVar25 = 0;
                  if (local_c38 <= paVar19) {
                    uVar25 = (long)paVar19 - (long)local_c38;
                  }
                  local_888[0] = local_878;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_888,"4","");
                  local_cb8._0_4_ = 0xca;
                  std::__cxx11::string::_M_assign((string *)&local_cb0);
                  if (local_888[0] != local_878) {
                    operator_delete(local_888[0],local_878[0] + 1);
                  }
                  local_9b8._0_4_ = local_cb8._0_4_;
                  local_9b0._M_p = (pointer)&local_9a0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_9b0,local_cb0._M_p,local_cb0._M_p + local_ca8._0_8_);
                  local_990 = (BinaryRegionCommentType)
                              local_c90.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_988._M_p = (pointer)&local_978;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_988,
                             local_c90.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (char *)((long)local_c90.
                                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                     (long)&(local_c90.
                                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            offset));
                  local_968._M_p = (pointer)&local_958;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_968,local_c68._M_p,local_c68._M_p + local_c60);
                  local_948 = local_c48;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c18,(uint64_t)paVar33,uVar25,Unknown,uVar25,0,
                             (BinaryRegionComment *)local_9b8);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>
                            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              *)local_b58,(BinaryRegion *)local_c18);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_ba0._M_p != local_c28) {
                    operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bc0._M_p != &local_bb0) {
                    operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bf0.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                    operator_delete(local_bf0.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_968._M_p != &local_958) {
                    operator_delete(local_968._M_p,local_958._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_988._M_p != &local_978) {
                    operator_delete(local_988._M_p,local_978._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_9b0._M_p != &local_9a0) {
                    operator_delete(local_9b0._M_p,local_9a0._M_allocated_capacity + 1);
                  }
                  lVar24 = 6;
                }
                else {
                  paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((ulong)*(uint *)(local_c20->binary_ + (long)local_c38) +
                               (long)local_c38);
                  if (paVar31 < paVar19) {
                    if (paVar31 == local_cc0) {
                      local_9d8[0] = local_9c8;
                      std::__cxx11::string::_M_construct<char_const*>((string *)local_9d8,"");
                      local_cb8._0_4_ = 0xcf;
                      std::__cxx11::string::_M_assign((string *)&local_cb0);
                      if (local_9d8[0] != local_9c8) {
                        operator_delete(local_9d8[0],local_9c8[0] + 1);
                      }
                      local_430._0_4_ = local_cb8._0_4_;
                      local_428._M_p = (pointer)&local_418;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_428,local_cb0._M_p,
                                 local_cb0._M_p + local_ca8._0_8_);
                      local_408 = (BinaryRegionCommentType)
                                  local_c90.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      local_400._M_p = (pointer)&local_3f0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_400,
                                 local_c90.
                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (char *)((long)local_c90.
                                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                ._M_impl.super__Vector_impl_data._M_finish +
                                         (long)&(local_c90.
                                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                                ->offset));
                      local_3e0._M_p = (pointer)&local_3d0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_3e0,local_c68._M_p,local_c68._M_p + local_c60);
                      local_3c0 = local_c48;
                      anon_unknown_49::MakeBinaryRegion
                                ((BinaryRegion *)local_c18,(uint64_t)paVar33,4,UOffset,0,
                                 (uint64_t)local_cc0,(BinaryRegionComment *)local_430);
                      std::
                      vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ::emplace_back<flatbuffers::BinaryRegion>
                                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  *)local_b58,(BinaryRegion *)local_c18);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_ba0._M_p != local_c28) {
                        operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_bc0._M_p != &local_bb0) {
                        operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_bf0.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                        operator_delete(local_bf0.
                                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        local_bd8._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_3e0._M_p != &local_3d0) {
                        operator_delete(local_3e0._M_p,local_3d0._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_400._M_p != &local_3f0) {
                        operator_delete(local_400._M_p,local_3f0._M_allocated_capacity + 1);
                      }
                      uVar29 = local_418._M_allocated_capacity;
                      _Var30._M_p = local_428._M_p;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_428._M_p != &local_418) goto LAB_0030e47f;
                    }
                    else {
                      local_4a8._0_4_ = OK;
                      local_4a0._M_p = (pointer)&local_490;
                      std::__cxx11::string::_M_construct<char*>((string *)&local_4a0,local_ca8 + 8);
                      local_480 = (BinaryRegionCommentType)
                                  local_c90.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                      local_478._M_p = (pointer)&local_468;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_478,
                                 local_c90.
                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (char *)((long)local_c90.
                                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                ._M_impl.super__Vector_impl_data._M_finish +
                                         (long)&(local_c90.
                                                 super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                                ->offset));
                      local_458._M_p = (pointer)&local_448;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_458,local_c68._M_p,local_c68._M_p + local_c60);
                      local_438 = local_c48;
                      anon_unknown_49::MakeBinaryRegion
                                ((BinaryRegion *)local_c18,(uint64_t)paVar33,4,UOffset,0,
                                 (uint64_t)paVar31,(BinaryRegionComment *)local_4a8);
                      std::
                      vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ::emplace_back<flatbuffers::BinaryRegion>
                                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  *)local_b58,(BinaryRegion *)local_c18);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_ba0._M_p != local_c28) {
                        operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_bc0._M_p != &local_bb0) {
                        operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_bf0.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                        operator_delete(local_bf0.
                                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                        ._M_impl.super__Vector_impl_data._M_finish,
                                        local_bd8._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_458._M_p != &local_448) {
                        operator_delete(local_458._M_p,local_448._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_478._M_p != &local_468) {
                        operator_delete(local_478._M_p,local_468._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4a0._M_p != &local_490) {
                        operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
                      }
                      BuildTable(pBVar6,(uint64_t)paVar31,Table,(Object *)local_b30);
                    }
                  }
                  else {
                    local_a38[0] = local_a28;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_a38,"");
                    local_cb8._0_4_ = 0xc9;
                    std::__cxx11::string::_M_assign((string *)&local_cb0);
                    if (local_a38[0] != local_a28) {
                      operator_delete(local_a38[0],local_a28[0] + 1);
                    }
                    local_3b8._0_4_ = local_cb8._0_4_;
                    local_3b0._M_p = (pointer)&local_3a0;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_3b0,local_cb0._M_p,local_cb0._M_p + local_ca8._0_8_)
                    ;
                    local_390 = (BinaryRegionCommentType)
                                local_c90.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    local_388._M_p = (pointer)&local_378;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_388,
                               local_c90.
                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                               ._M_impl.super__Vector_impl_data._M_finish,
                               (char *)((long)local_c90.
                                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                              ._M_impl.super__Vector_impl_data._M_finish +
                                       (long)&(local_c90.
                                               super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                              offset));
                    local_368._M_p = (pointer)&local_358;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_368,local_c68._M_p,local_c68._M_p + local_c60);
                    local_348 = local_c48;
                    anon_unknown_49::MakeBinaryRegion
                              ((BinaryRegion *)local_c18,(uint64_t)paVar33,4,UOffset,0,
                               (uint64_t)paVar31,(BinaryRegionComment *)local_3b8);
                    std::
                    vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                    emplace_back<flatbuffers::BinaryRegion>
                              ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                *)local_b58,(BinaryRegion *)local_c18);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_ba0._M_p != local_c28) {
                      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bc0._M_p != &local_bb0) {
                      operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_bf0.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                      operator_delete(local_bf0.
                                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,
                                      local_bd8._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_368._M_p != &local_358) {
                      operator_delete(local_368._M_p,local_358._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_388._M_p != &local_378) {
                      operator_delete(local_388._M_p,local_378._M_allocated_capacity + 1);
                    }
                    uVar29 = local_3a0._M_allocated_capacity;
                    _Var30._M_p = local_3b0._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b0._M_p != &local_3a0) {
LAB_0030e47f:
                      operator_delete(_Var30._M_p,uVar29 + 1);
                    }
                  }
                  lVar24 = 0;
                  paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(paVar33->_M_local_buf + 4);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c68._M_p != &local_c58) {
                  operator_delete(local_c68._M_p,
                                  CONCAT71(local_c58._M_allocated_capacity._1_7_,
                                           local_c58._M_local_buf[0]) + 1);
                }
                local_c38 = paVar33;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c90.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_c78) {
                  operator_delete(local_c90.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  CONCAT71(local_c78._M_allocated_capacity._1_7_,
                                           local_c78._M_local_buf[0]) + 1);
                }
                if (local_cb0._M_p != local_ca8 + 8) {
                  operator_delete(local_cb0._M_p,local_ca8._8_8_ + 1);
                }
              } while ((lVar24 == 0) &&
                      (paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)(paVar26->_M_local_buf + 1), local_c30 != paVar26));
            }
          }
          else if (local_c30 !=
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0) {
            local_c30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((long)local_c30 - 1);
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            do {
              NumToString<unsigned_long>((string *)local_cb8,(unsigned_long)paVar26);
              plVar16 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_cb8,0,(char *)0x0,0x379344);
              pSVar14 = local_b30;
              paVar19 = local_c38;
              plVar22 = plVar16 + 2;
              if ((long *)*plVar16 == plVar22) {
                local_c18._16_8_ = *plVar22;
                local_c18._24_8_ = plVar16[3];
                local_c18._0_8_ = local_c18 + 0x10;
              }
              else {
                local_c18._16_8_ = *plVar22;
                local_c18._0_8_ = (long *)*plVar16;
              }
              local_c18._8_8_ = plVar16[1];
              *plVar16 = (long)plVar22;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              plVar16 = (long *)std::__cxx11::string::append(local_c18);
              psVar18 = (size_type *)(plVar16 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar16 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_a18.field_2._M_allocated_capacity = *psVar18;
                local_a18.field_2._8_8_ = plVar16[3];
                local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
              }
              else {
                local_a18.field_2._M_allocated_capacity = *psVar18;
                local_a18._M_dataplus._M_p = (pointer)*plVar16;
              }
              local_a18._M_string_length = plVar16[1];
              *plVar16 = (long)psVar18;
              plVar16[1] = 0;
              *(undefined1 *)(plVar16 + 2) = 0;
              paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)BuildStruct(this_00,(uint64_t)paVar19,
                                       (vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                        *)local_b58,&local_a18,(Object *)pSVar14);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
                operator_delete(local_a18._M_dataplus._M_p,
                                local_a18.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_c18._0_8_ != local_c18 + 0x10) {
                operator_delete((void *)local_c18._0_8_,local_c18._16_8_ + 1);
              }
              if (local_cb8 != (undefined1  [8])local_ca8) {
                operator_delete((void *)local_cb8,local_ca8._0_8_ + 1);
              }
            } while ((paVar33 != paVar19) &&
                    (bVar8 = local_c30 != paVar26,
                    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(paVar26->_M_local_buf + 1), local_c38 = paVar33, bVar8));
          }
        }
        else {
          if (FVar2.super_Table != (Table)0xd) goto LAB_0030c22f;
          if (local_c30 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            local_cc0 = &local_b90;
            paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
            do {
              paVar33 = local_c38;
              local_c90.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_c78;
              local_cb8 = (undefined1  [8])((ulong)local_cb8 & 0xffffffff00000000);
              local_cb0._M_p = local_ca8 + 8;
              local_ca8._0_8_ = 0;
              local_ca8._8_8_ = local_ca8._8_8_ & 0xffffffffffffff00;
              local_c90.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_c78._M_local_buf[0] = '\0';
              local_c68._M_p = (pointer)&local_c58;
              local_c60 = 0;
              local_c58._M_local_buf[0] = '\0';
              local_c90.
              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = VectorStringValue;
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c20->binary_length_;
              local_c48 = paVar26;
              if (paVar19 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x5 ||
                  paVar19 <=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_c38->_M_local_buf + 3)) {
                uVar25 = 0;
                if (local_c38 <= paVar19) {
                  uVar25 = (long)paVar19 - (long)local_c38;
                }
                local_8a8[0] = local_898;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_8a8,"4","");
                local_cb8._0_4_ = 0xca;
                std::__cxx11::string::_M_assign((string *)&local_cb0);
                if (local_8a8[0] != local_898) {
                  operator_delete(local_8a8[0],local_898[0] + 1);
                }
                local_920._0_4_ = local_cb8._0_4_;
                local_918._M_p = (pointer)&local_908;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_918,local_cb0._M_p,local_cb0._M_p + local_ca8._0_8_);
                local_8f8 = (BinaryRegionCommentType)
                            local_c90.
                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                local_8f0._M_p = (pointer)&local_8e0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_8f0,
                           local_c90.
                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (char *)((long)local_c90.
                                          super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                          ._M_impl.super__Vector_impl_data._M_finish +
                                   (long)&(local_c90.
                                           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          offset));
                local_8d0._M_p = (pointer)&local_8c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_8d0,local_c68._M_p,local_c68._M_p + local_c60);
                local_8b0 = local_c48;
                anon_unknown_49::MakeBinaryRegion
                          ((BinaryRegion *)local_c18,(uint64_t)paVar33,uVar25,Unknown,uVar25,0,
                           (BinaryRegionComment *)local_920);
                std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                emplace_back<flatbuffers::BinaryRegion>
                          ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                            *)local_b58,(BinaryRegion *)local_c18);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_ba0._M_p != local_cc0) {
                  operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bc0._M_p != &local_bb0) {
                  operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_bf0.
                       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                  operator_delete(local_bf0.
                                  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                                  local_bd8._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8d0._M_p != &local_8c0) {
                  operator_delete(local_8d0._M_p,local_8c0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_8f0._M_p != &local_8e0) {
                  operator_delete(local_8f0._M_p,local_8e0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_918._M_p != &local_908) {
                  operator_delete(local_918._M_p,local_908._M_allocated_capacity + 1);
                }
                iVar23 = 9;
              }
              else {
                paVar31 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((ulong)*(uint *)(local_c20->binary_ + (long)local_c38) +
                             (long)local_c38);
                if (paVar31 < paVar19) {
                  local_598._0_4_ = OK;
                  local_590._M_p = (pointer)&local_580;
                  std::__cxx11::string::_M_construct<char*>((string *)&local_590,local_ca8 + 8);
                  local_570 = (BinaryRegionCommentType)
                              local_c90.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_568._M_p = (pointer)&local_558;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_568,
                             local_c90.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (char *)((long)local_c90.
                                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                     (long)&(local_c90.
                                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            offset));
                  pBVar6 = local_c20;
                  local_548._M_p = (pointer)&local_538;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_548,local_c68._M_p,local_c68._M_p + local_c60);
                  local_528 = local_c48;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c18,(uint64_t)paVar33,4,UOffset,0,
                             (uint64_t)paVar31,(BinaryRegionComment *)local_598);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>
                            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              *)local_b58,(BinaryRegion *)local_c18);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_ba0._M_p != local_cc0) {
                    operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bc0._M_p != &local_bb0) {
                    operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bf0.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                    operator_delete(local_bf0.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_548._M_p != &local_538) {
                    operator_delete(local_548._M_p,local_538._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_568._M_p != &local_558) {
                    operator_delete(local_568._M_p,local_558._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_590._M_p != &local_580) {
                    operator_delete(local_590._M_p,local_580._M_allocated_capacity + 1);
                  }
                  iVar23 = 0;
                  BuildString(pBVar6,(uint64_t)paVar31,local_b00,local_c40);
                }
                else {
                  local_940[0] = local_930;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_940,"");
                  local_cb8._0_4_ = 0xc9;
                  std::__cxx11::string::_M_assign((string *)&local_cb0);
                  if (local_940[0] != local_930) {
                    operator_delete(local_940[0],local_930[0] + 1);
                  }
                  local_520._0_4_ = local_cb8._0_4_;
                  local_518._M_p = (pointer)&local_508;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_518,local_cb0._M_p,local_cb0._M_p + local_ca8._0_8_);
                  local_4f8 = (BinaryRegionCommentType)
                              local_c90.
                              super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  local_4f0._M_p = (pointer)&local_4e0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4f0,
                             local_c90.
                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             (char *)((long)local_c90.
                                            super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                            ._M_impl.super__Vector_impl_data._M_finish +
                                     (long)&(local_c90.
                                             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                            offset));
                  local_4d0._M_p = (pointer)&local_4c0;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4d0,local_c68._M_p,local_c68._M_p + local_c60);
                  local_4b0 = local_c48;
                  anon_unknown_49::MakeBinaryRegion
                            ((BinaryRegion *)local_c18,(uint64_t)paVar33,4,UOffset,0,
                             (uint64_t)paVar31,(BinaryRegionComment *)local_520);
                  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                  ::emplace_back<flatbuffers::BinaryRegion>
                            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                              *)local_b58,(BinaryRegion *)local_c18);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_ba0._M_p != local_cc0) {
                    operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bc0._M_p != &local_bb0) {
                    operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_bf0.
                         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
                    operator_delete(local_bf0.
                                    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    local_bd8._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4d0._M_p != &local_4c0) {
                    operator_delete(local_4d0._M_p,local_4c0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4f0._M_p != &local_4e0) {
                    operator_delete(local_4f0._M_p,local_4e0._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_518._M_p != &local_508) {
                    operator_delete(local_518._M_p,local_508._M_allocated_capacity + 1);
                  }
                  iVar23 = 0xb;
                }
                paVar33 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar33->_M_local_buf + 4);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c68._M_p != &local_c58) {
                operator_delete(local_c68._M_p,
                                CONCAT71(local_c58._M_allocated_capacity._1_7_,
                                         local_c58._M_local_buf[0]) + 1);
              }
              local_c38 = paVar33;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c90.
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_finish != &local_c78) {
                operator_delete(local_c90.
                                super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                                CONCAT71(local_c78._M_allocated_capacity._1_7_,
                                         local_c78._M_local_buf[0]) + 1);
              }
              if (local_cb0._M_p != local_ca8 + 8) {
                operator_delete(local_cb0._M_p,local_ca8._8_8_ + 1);
              }
            } while (((iVar23 == 0xb) || (iVar23 == 0)) &&
                    (paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(paVar26->_M_local_buf + 1), local_c30 != paVar26));
          }
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b28,
                 (char *)(local_b00 + *(ushort *)(local_b00 + (4 - (long)*(int *)local_b00)) +
                         (ulong)*(uint *)(local_b00 +
                                         *(ushort *)(local_b00 + (4 - (long)*(int *)local_b00))) + 4
                         ),&local_cc1);
      puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_b28);
      pBVar6 = local_c20;
      psVar18 = puVar15 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_b78.field_2._M_allocated_capacity = *psVar18;
        local_b78.field_2._8_8_ = puVar15[3];
        local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
      }
      else {
        local_b78.field_2._M_allocated_capacity = *psVar18;
        local_b78._M_dataplus._M_p = (pointer)*puVar15;
      }
      local_b78._M_string_length = puVar15[1];
      *puVar15 = psVar18;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_b78);
      psVar18 = (size_type *)(plVar16 + 2);
      if ((size_type *)*plVar16 == psVar18) {
        local_ca8._0_8_ = *psVar18;
        local_ca8._8_8_ = plVar16[3];
        local_cb8 = (undefined1  [8])local_ca8;
      }
      else {
        local_ca8._0_8_ = *psVar18;
        local_cb8 = (undefined1  [8])*plVar16;
      }
      local_cb0._M_p = (pointer)plVar16[1];
      *plVar16 = (long)psVar18;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      local_138.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_b58._0_8_;
      local_138.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_b58._8_8_;
      local_138.
      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b58._16_8_;
      local_b58._16_8_ = (pointer)0x0;
      local_b58._0_8_ = (pointer)0x0;
      local_b58._8_8_ = (pointer)0x0;
      anon_unknown_49::MakeBinarySection
                ((BinarySection *)local_c18,(string *)local_cb8,local_b04,&local_138);
      AddSection(pBVar6,local_a80,(BinarySection *)local_c18);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_bf0);
      if ((undefined1 *)local_c18._0_8_ != local_c18 + 0x10) {
        operator_delete((void *)local_c18._0_8_,local_c18._16_8_ + 1);
      }
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                (&local_138);
      if (local_cb8 != (undefined1  [8])local_ca8) {
        operator_delete((void *)local_cb8,local_ca8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
        operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
        operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
      }
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                 local_b58);
      goto LAB_0030ea47;
    }
    local_2e0[0] = local_2d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"");
    local_af8 = ERROR_LENGTH_TOO_LONG;
    std::__cxx11::string::_M_assign((string *)&local_af0);
    if (local_2e0[0] != local_2d0) {
      operator_delete(local_2e0[0],local_2d0[0] + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b58,
               (char *)(local_b00 + *(ushort *)(local_b00 + (4 - (long)*(int *)local_b00)) +
                       (ulong)*(uint *)(local_b00 +
                                       *(ushort *)(local_b00 + (4 - (long)*(int *)local_b00))) + 4),
               &local_cc1);
    puVar15 = (undefined8 *)std::__cxx11::string::append(local_b58);
    local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_b28.field_2._M_allocated_capacity = *psVar18;
      local_b28.field_2._8_8_ = puVar15[3];
    }
    else {
      local_b28.field_2._M_allocated_capacity = *psVar18;
      local_b28._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_b28._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_b28);
    local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
    psVar18 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_b78.field_2._M_allocated_capacity = *psVar18;
      local_b78.field_2._8_8_ = puVar15[3];
    }
    else {
      local_b78.field_2._M_allocated_capacity = *psVar18;
      local_b78._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_b78._M_string_length = puVar15[1];
    *puVar15 = psVar18;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    local_2a0._0_4_ = local_af8;
    local_298._M_p = (pointer)&local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_af0,local_af0->_M_local_buf + local_ae8);
    local_278 = local_ad0;
    local_270._M_p = (pointer)&local_260;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,local_ac8,local_ac8 + local_ac0._M_allocated_capacity);
    local_250._M_p = (pointer)&local_240;
    std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_aa8,local_aa8 + local_aa0);
    local_230 = local_a88;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_c18,vector_offset,uVar25,type,0,0,
               (BinaryRegionComment *)local_2a0);
    anon_unknown_49::MakeSingleRegionBinarySection
              ((BinarySection *)local_cb8,&local_b78,Vector,(BinaryRegion *)local_c18);
    AddSection(this,vector_offset,(BinarySection *)local_cb8);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_c90);
    if (local_cb8 != (undefined1  [8])local_ca8) {
      operator_delete((void *)local_cb8,local_ca8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ba0._M_p != &local_b90) {
      operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bc0._M_p != &local_bb0) {
      operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf0.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_bd8) {
      operator_delete(local_bf0.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_bd8._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_p != &local_240) {
      operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_p != &local_260) {
      operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
    }
    local_198._M_allocated_capacity = local_288._M_allocated_capacity;
    _Var30._M_p = local_298._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_p != &local_288) goto LAB_0030c543;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
    operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_b58._0_8_ != (pointer)(local_b58 + 0x10)) {
    operator_delete((void *)local_b58._0_8_,(ulong)((long)(uint64_t *)local_b58._16_8_ + 1));
  }
LAB_0030ea47:
  if (local_aa8 != &local_a98) {
    operator_delete(local_aa8,CONCAT71(uStack_a97,local_a98) + 1);
  }
  if (local_ac8 != local_ac0._M_local_buf + 8) {
    operator_delete(local_ac8,CONCAT71(local_ac0._9_7_,local_ac0._M_local_buf[8]) + 1);
  }
  if (local_af0 != &local_ae0) {
    operator_delete(local_af0,
                    CONCAT71(local_ae0._M_allocated_capacity._1_7_,local_ae0._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void BinaryAnnotator::BuildVector(
    const uint64_t vector_offset, const reflection::Object *const table,
    const reflection::Field *const field, const uint64_t parent_table_offset,
    const std::map<uint16_t, VTable::Entry> vtable_fields) {
  if (ContainsSection(vector_offset)) { return; }

  BinaryRegionComment vector_length_comment;
  vector_length_comment.type = BinaryRegionCommentType::VectorLength;

  const bool is_64_bit_vector =
      field->type()->base_type() == reflection::BaseType::Vector64;

  flatbuffers::Optional<uint64_t> vector_length;
  uint32_t vector_length_size_type = 0;
  BinaryRegionType region_type = BinaryRegionType::Uint32;
  BinarySectionType section_type = BinarySectionType::Vector;

  if (is_64_bit_vector) {
    auto v = ReadScalar<uint64_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint64_t);
    region_type = BinaryRegionType::Uint64;
    section_type = BinarySectionType::Vector64;
  } else {
    auto v = ReadScalar<uint32_t>(vector_offset);
    if (v.has_value()) { vector_length = v.value(); }
    vector_length_size_type = sizeof(uint32_t);
    region_type = BinaryRegionType::Uint32;
    section_type = BinarySectionType::Vector;
  }

  if (!vector_length.has_value()) {
    const uint64_t remaining = RemainingBytes(vector_offset);
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, remaining,
                             BinaryRegionType::Unknown, remaining, 0,
                             vector_length_comment)));
    return;
  }

  // Validate there are enough bytes left in the binary to process all the
  // items.
  const uint64_t last_item_offset =
      vector_offset + vector_length_size_type +
      vector_length.value() * GetElementSize(field);

  if (!IsValidOffset(last_item_offset - 1)) {
    SetError(vector_length_comment, BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);
    AddSection(
        vector_offset,
        MakeSingleRegionBinarySection(
            std::string(table->name()->c_str()) + "." + field->name()->c_str(),
            BinarySectionType::Vector,
            MakeBinaryRegion(vector_offset, vector_length_size_type,
                             region_type, 0, 0, vector_length_comment)));

    return;
  }

  std::vector<BinaryRegion> regions;

  regions.push_back(MakeBinaryRegion(vector_offset, vector_length_size_type,
                                     region_type, 0, 0, vector_length_comment));
  // Consume the vector length offset.
  uint64_t offset = vector_offset + vector_length_size_type;

  switch (field->type()->element()) {
    case reflection::BaseType::Obj: {
      const reflection::Object *object =
          schema_->objects()->Get(field->type()->index());

      if (object->is_struct()) {
        // Vector of structs
        for (size_t i = 0; i < vector_length.value(); ++i) {
          // Structs are inline to the vector.
          const uint64_t next_offset =
              BuildStruct(offset, regions, "[" + NumToString(i) + "]", object);
          if (next_offset == offset) { break; }
          offset = next_offset;
        }
      } else {
        // Vector of objects
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_object_comment;
          vector_object_comment.type =
              BinaryRegionCommentType::VectorTableValue;
          vector_object_comment.index = i;

          const auto table_relative_offset = ReadScalar<uint32_t>(offset);
          if (!table_relative_offset.has_value()) {
            const uint64_t remaining = RemainingBytes(offset);
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_object_comment));
            break;
          }

          // The table offset is relative from the offset location itself.
          const uint64_t table_offset = offset + table_relative_offset.value();

          if (!IsValidOffset(table_offset)) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          if (table_offset == parent_table_offset) {
            SetError(vector_object_comment,
                     BinaryRegionStatus::ERROR_CYCLE_DETECTED);
            // A cycle detected where a table vector field is pointing to
            // itself. This should only happen in corrupted files.
            regions.push_back(MakeBinaryRegion(
                offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
                table_offset, vector_object_comment));

            offset += sizeof(uint32_t);
            continue;
          }

          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              table_offset, vector_object_comment));

          // Consume the offset to the table.
          offset += sizeof(uint32_t);

          BuildTable(table_offset, BinarySectionType::Table, object);
        }
      }
    } break;
    case reflection::BaseType::String: {
      // Vector of strings
      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment vector_object_comment;
        vector_object_comment.type = BinaryRegionCommentType::VectorStringValue;
        vector_object_comment.index = i;

        const auto string_relative_offset = ReadScalar<uint32_t>(offset);
        if (!string_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(
              MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                               remaining, 0, vector_object_comment));
          break;
        }

        // The string offset is relative from the offset location itself.
        const uint64_t string_offset = offset + string_relative_offset.value();

        if (!IsValidOffset(string_offset)) {
          SetError(vector_object_comment,
                   BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);
          regions.push_back(MakeBinaryRegion(
              offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
              string_offset, vector_object_comment));

          offset += sizeof(uint32_t);
          continue;
        }

        regions.push_back(MakeBinaryRegion(
            offset, sizeof(uint32_t), BinaryRegionType::UOffset, 0,
            string_offset, vector_object_comment));

        BuildString(string_offset, table, field);

        offset += sizeof(uint32_t);
      }
    } break;
    case reflection::BaseType::Union: {
      // Vector of unions
      // Unions have both their realized type (uint8_t for now) that are
      // stored separately. These are stored in the field->index() - 1
      // location.
      const uint16_t union_type_vector_id = field->id() - 1;

      auto vtable_entry = vtable_fields.find(union_type_vector_id);
      if (vtable_entry == vtable_fields.end()) {
        // TODO(dbaileychess): need to capture this error condition.
        break;
      }

      const uint64_t union_type_vector_field_offset =
          parent_table_offset + vtable_entry->second.offset_from_table;

      const auto union_type_vector_field_relative_offset =
          ReadScalar<uint16_t>(union_type_vector_field_offset);

      if (!union_type_vector_field_relative_offset.has_value()) {
        const uint64_t remaining = RemainingBytes(offset);
        BinaryRegionComment vector_union_comment;
        vector_union_comment.type = BinaryRegionCommentType::VectorUnionValue;
        SetError(vector_union_comment,
                 BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "2");

        regions.push_back(MakeBinaryRegion(offset, remaining,
                                           BinaryRegionType::Unknown, remaining,
                                           0, vector_union_comment));

        break;
      }

      // Get the offset to the first type (the + sizeof(uint32_t) is to skip
      // over the vector length which we already know). Validation happens
      // within the loop below.
      const uint64_t union_type_vector_data_offset =
          union_type_vector_field_offset +
          union_type_vector_field_relative_offset.value() + sizeof(uint32_t);

      for (size_t i = 0; i < vector_length.value(); ++i) {
        BinaryRegionComment comment;
        comment.type = BinaryRegionCommentType::VectorUnionValue;
        comment.index = i;

        const auto union_relative_offset = ReadScalar<uint32_t>(offset);
        if (!union_relative_offset.has_value()) {
          const uint64_t remaining = RemainingBytes(offset);

          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "4");

          regions.push_back(MakeBinaryRegion(offset, remaining,
                                             BinaryRegionType::Unknown,
                                             remaining, 0, comment));

          break;
        }

        // The union offset is relative from the offset location itself.
        const uint64_t union_offset = offset + union_relative_offset.value();

        if (!IsValidOffset(union_offset)) {
          SetError(comment, BinaryRegionStatus::ERROR_OFFSET_OUT_OF_BINARY);

          regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                             BinaryRegionType::UOffset, 0,
                                             union_offset, comment));
          continue;
        }

        const auto realized_type =
            ReadScalar<uint8_t>(union_type_vector_data_offset + i);

        if (!realized_type.has_value()) {
          SetError(comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY, "1");
          regions.push_back(MakeBinaryRegion(
              offset, 0, BinaryRegionType::Unknown, 0, 0, comment));
          continue;
        }

        if (!IsValidUnionValue(vtable_entry->second.field->type()->index(),
                               realized_type.value())) {
          // We already export an error in the union type field, so just skip
          // building the union itself and it will default to an unreference
          // Binary section.
          offset += sizeof(uint32_t);
          continue;
        }

        const std::string enum_type =
            BuildUnion(union_offset, realized_type.value(), field);

        comment.default_value = "(`" + enum_type + "`)";
        regions.push_back(MakeBinaryRegion(offset, sizeof(uint32_t),
                                           BinaryRegionType::UOffset, 0,
                                           union_offset, comment));

        offset += sizeof(uint32_t);
      }
    } break;
    default: {
      if (IsScalar(field->type()->element())) {
        const BinaryRegionType binary_region_type =
            GetRegionType(field->type()->element());

        const uint64_t type_size = GetTypeSize(field->type()->element());

        // TODO(dbaileychess): It might be nicer to user the
        // BinaryRegion.array_length field to indicate this.
        for (size_t i = 0; i < vector_length.value(); ++i) {
          BinaryRegionComment vector_scalar_comment;
          vector_scalar_comment.type = BinaryRegionCommentType::VectorValue;
          vector_scalar_comment.index = i;

          if (!IsValidRead(offset, type_size)) {
            const uint64_t remaining = RemainingBytes(offset);

            SetError(vector_scalar_comment,
                     BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
                     std::to_string(type_size));

            regions.push_back(
                MakeBinaryRegion(offset, remaining, BinaryRegionType::Unknown,
                                 remaining, 0, vector_scalar_comment));
            break;
          }

          if (IsUnionType(field->type()->element())) {
            // This is a type for a union. Validate the value
            const auto enum_value = ReadScalar<uint8_t>(offset);

            // This should always have a value, due to the IsValidRead check
            // above.
            if (!IsValidUnionValue(field->type()->index(),
                                   enum_value.value())) {
              SetError(vector_scalar_comment,
                       BinaryRegionStatus::ERROR_INVALID_UNION_TYPE);
              regions.push_back(MakeBinaryRegion(offset, type_size,
                                                 binary_region_type, 0, 0,
                                                 vector_scalar_comment));
              offset += type_size;
              continue;
            }
          }

          regions.push_back(MakeBinaryRegion(offset, type_size,
                                             binary_region_type, 0, 0,
                                             vector_scalar_comment));
          offset += type_size;
        }
      }
    } break;
  }
  AddSection(vector_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               section_type, std::move(regions)));
}